

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faxman.h
# Opt level: O0

bool ClownLZSS::Internal::Faxman::Compress<std::ofstream>
               (uchar *data,size_t data_size,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  bool bVar1;
  type pCVar2;
  pos_type pVar3;
  ulong local_f0;
  undefined1 local_c0 [8];
  pos_type end_position;
  size_t length;
  size_t distance;
  ClownLZSS_Match *match;
  anon_class_16_2_7b5571ae PushDescriptorBit;
  undefined1 local_80 [4];
  uint descriptor_bits_total;
  DescriptorFieldWriter<decltype(output)> descriptor_bits;
  pos_type header_position;
  size_t local_38;
  size_t total_matches;
  Matches matches;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output_local;
  size_t data_size_local;
  uchar *data_local;
  
  matches._M_t.super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
  super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
  super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl =
       (__uniq_ptr_data<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter,_true,_true>)
       (__uniq_ptr_data<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter,_true,_true>)output;
  std::unique_ptr<ClownLZSS_Match[],ClownLZSS::Internal::MatchDeleter>::
  unique_ptr<ClownLZSS::Internal::MatchDeleter,void>
            ((unique_ptr<ClownLZSS_Match[],ClownLZSS::Internal::MatchDeleter> *)&total_matches);
  bVar1 = FindOptimalMatches(-1,0x22,0x800,FindExtraMatches,9,GetMatchCost,data,1,data_size,
                             (Matches *)&total_matches,&local_38,(void *)0x0);
  if (bVar1) {
    pVar3 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            ::Tell((OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                    *)matches._M_t.
                      super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t
                      .super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                      super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl);
    descriptor_bits.descriptor_position._M_state = (__mbstate_t)pVar3._M_off;
    OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::WriteLE16((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)matches._M_t.
                   super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                   super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                   super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,0);
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::DescriptorFieldWriter
              ((DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                *)local_80,
               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
               matches._M_t.
               super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
               super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
               super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl);
    PushDescriptorBit.descriptor_bits_total._4_4_ = 0;
    match = (ClownLZSS_Match *)local_80;
    PushDescriptorBit.descriptor_bits =
         (DescriptorFieldWriter<decltype(output)> *)
         ((long)&PushDescriptorBit.descriptor_bits_total + 4);
    for (distance = (size_t)std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::
                            operator[]((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>
                                        *)&total_matches,0);
        pCVar2 = std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::operator[]
                           ((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter> *)
                            &total_matches,local_38), (type)distance != pCVar2;
        distance = distance + 0x18) {
      if (*(long *)distance == *(long *)(distance + 8) + 1) {
        Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
        operator()((anon_class_16_2_7b5571ae *)&match,true);
        OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
        ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)matches._M_t.
                   super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                   super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                   super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
                data[*(long *)(distance + 8)]);
      }
      else {
        if (*(long *)(distance + 8) == *(long *)distance) {
          local_f0 = 0x800;
        }
        else {
          local_f0 = *(long *)(distance + 8) - *(long *)distance;
        }
        end_position._M_state = *(__mbstate_t *)(distance + 0x10);
        length._0_4_ = (int)local_f0;
        if ((((ulong)end_position._M_state < 2) || (5 < (ulong)end_position._M_state)) ||
           (0x100 < local_f0)) {
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()((anon_class_16_2_7b5571ae *)&match,false);
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()((anon_class_16_2_7b5571ae *)&match,true);
          OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *)matches._M_t.
                     super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                     super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                     super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
                  (char)local_f0 + 0xff);
          OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *)matches._M_t.
                     super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                     super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                     super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
                  (byte)(((int)length - 1U & 0x700) >> 3) | (char)end_position._M_state.__count - 3U
                 );
        }
        else {
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()((anon_class_16_2_7b5571ae *)&match,false);
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()((anon_class_16_2_7b5571ae *)&match,false);
          OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *)matches._M_t.
                     super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                     super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                     super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,-(char)local_f0);
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()((anon_class_16_2_7b5571ae *)&match,
                     SUB41((end_position._M_state.__count - 2U & 2) >> 1,0));
          Compress<std::basic_ofstream<char,_std::char_traits<char>_>_>::anon_class_16_2_7b5571ae::
          operator()((anon_class_16_2_7b5571ae *)&match,
                     (bool)((char)end_position._M_state.__count - 2U & 1));
        }
      }
    }
    pVar3 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            ::Tell((OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                    *)matches._M_t.
                      super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t
                      .super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                      super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl);
    end_position._M_off = (streamoff)pVar3._M_state;
    local_c0 = (undefined1  [8])pVar3._M_off;
    OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Seek((OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            *)matches._M_t.super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>
              ._M_t.super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
              super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
           (pos_type *)&descriptor_bits.descriptor_position._M_state);
    OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::WriteLE16((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)matches._M_t.
                   super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                   super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                   super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
                PushDescriptorBit.descriptor_bits_total._4_4_);
    OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Seek((OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            *)matches._M_t.super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>
              ._M_t.super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
              super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,(pos_type *)local_c0);
    data_local._7_1_ = true;
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::~DescriptorFieldWriter
              ((DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                *)local_80);
  }
  else {
    data_local._7_1_ = false;
  }
  std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::~unique_ptr
            ((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter> *)&total_matches);
  return data_local._7_1_;
}

Assistant:

bool Compress(const unsigned char* const data, const std::size_t data_size, CompressorOutput<T> &output)
			{
				// Produce a series of LZSS compression matches.
				ClownLZSS::Matches matches;
				std::size_t total_matches;
				if (!ClownLZSS::FindOptimalMatches(-1, 0x1F + 3, 0x800, FindExtraMatches, 1 + 8, GetMatchCost, data, 1, data_size, &matches, &total_matches, nullptr))
					return false;

				// Track the location of the header...
				const auto header_position = output.Tell();

				// ...and insert a placeholder there.
				output.WriteLE16(0);

				DescriptorFieldWriter<decltype(output)> descriptor_bits(output);
				unsigned int descriptor_bits_total = 0;

				const auto PushDescriptorBit = [&](const bool value)
				{
					descriptor_bits.Push(value);
					++descriptor_bits_total;
				};

				// Produce Faxman-formatted data.
				for (ClownLZSS_Match *match = &matches[0]; match != &matches[total_matches]; ++match)
				{
					if (CLOWNLZSS_MATCH_IS_LITERAL(match))
					{
						PushDescriptorBit(1);
						output.Write(data[match->destination]);
					}
					else
					{
						const std::size_t distance = match->destination == match->source ? 0x800 : match->destination - match->source;
						const std::size_t length = match->length;

						if (length >= 2 && length <= 5 && distance <= 0x100)
						{
							PushDescriptorBit(0);
							PushDescriptorBit(0);
							output.Write(-distance & 0xFF);
							PushDescriptorBit(!!((length - 2) & 2));
							PushDescriptorBit(!!((length - 2) & 1));
						}
						else //if (length >= 3)
						{
							PushDescriptorBit(0);
							PushDescriptorBit(1);
							output.Write((distance - 1) & 0xFF);
							output.Write((((distance - 1) & 0x700) >> 3) | (length - 3));
						}
					}
				}

				// Grab the current position for later.
				const auto end_position = output.Tell();

				// Rewind to the header...
				output.Seek(header_position);

				// ...and complete it.
				output.WriteLE16(descriptor_bits_total);

				// Seek back to the end of the file just as the caller might expect us to do.
				output.Seek(end_position);

				return true;
			}